

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void fftCosInit(long M,float *Utbl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined4 *in_RSI;
  byte in_DIL;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  unsigned_long i1;
  unsigned_long fftN;
  ulong local_20;
  undefined1 extraout_var [56];
  
  uVar3 = 1L << (in_DIL & 0x3f);
  auVar4 = ZEXT464(0x3f800000);
  *in_RSI = 0x3f800000;
  for (local_20 = 1; local_20 < uVar3 >> 2; local_20 = local_20 + 1) {
    auVar1 = vcvtusi2sd_avx512f(auVar4._0_16_,local_20);
    auVar2 = vcvtusi2sd_avx512f(auVar1,uVar3);
    auVar5._0_8_ = cos((auVar1._0_8_ * 6.283185307179586) / auVar2._0_8_);
    auVar5._8_56_ = extraout_var;
    auVar4 = ZEXT1664(CONCAT124(auVar5._4_12_,(float)auVar5._0_8_));
    in_RSI[local_20] = (float)auVar5._0_8_;
  }
  *(undefined4 *)((long)in_RSI + (uVar3 & 0xfffffffffffffffc)) = 0;
  return;
}

Assistant:

void fftCosInit(long M, float *Utbl){
/* Compute Utbl, the cosine table for ffts	*/
/* of size (pow(2,M)/4 +1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *Utbl = cosine table	*/
unsigned long fftN = POW2(M);
unsigned long i1;
	Utbl[0] = 1.0;
	for (i1 = 1; i1 < fftN/4; i1++)
		Utbl[i1] = cos( (2.0 * MYPI * i1) / fftN );
	Utbl[fftN/4] = 0.0;
}